

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

void vkt::pipeline::anon_unknown_0::renderMultisampledImage
               (Context *context,CaseDef *caseDef,VkImage colorImage)

{
  int *piVar1;
  int iVar2;
  VkFormat format;
  undefined4 uVar3;
  undefined8 uVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  undefined4 uVar6;
  VkShaderModule fragmentModule;
  VkImageSubresourceRange subresourceRange;
  IVec2 renderSize;
  VkFramebuffer obj;
  VkPipelineBindPoint VVar7;
  undefined8 uVar8;
  undefined8 renderPass;
  VkCommandBuffer commandBuffer;
  bool bVar9;
  deUint32 dVar10;
  VkResult result;
  anon_unknown_0 *this;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  deUint64 *pdVar11;
  const_iterator cVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  VkSubpassDescription *pVVar16;
  pointer pVVar17;
  ulong uVar18;
  VkDeviceSize bufferSize;
  ulong __n;
  byte bVar19;
  VkBufferCreateInfo bufferCreateInfo;
  undefined1 local_248 [12];
  VkAttachmentLoadOp VStack_23c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  VkImageLayout VStack_228;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  Move<vk::Handle<(vk::HandleType)13>_> local_188;
  VkImageSubresourceRange res;
  Move<vk::Handle<(vk::HandleType)17>_> local_148;
  VkPipelineLayout local_128;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_120;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_d0;
  VkBuffer local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  VkCommandBuffer local_98;
  long *plStack_90;
  VkBufferCreateFlags local_88;
  undefined4 uStack_84;
  VkDeviceSize VStack_80;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkCommandPool local_58;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_50;
  
  bVar19 = 0;
  this = (anon_unknown_0 *)Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar10 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,2,dVar10,(VkAllocationCallbacks *)0x0);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_50.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,(DeviceInterface *)this,
                    device,(VkCommandPool)bufferCreateInfo._0_8_);
  local_88 = bufferCreateInfo.flags;
  uStack_84 = bufferCreateInfo._20_4_;
  VStack_80 = bufferCreateInfo.size;
  local_98 = (VkCommandBuffer)bufferCreateInfo._0_8_;
  plStack_90 = (long *)bufferCreateInfo.pNext;
  uVar4 = *(undefined8 *)(caseDef->renderSize).m_data;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < caseDef->numLayers) {
    dVar10 = 0;
    do {
      res.aspectMask = 1;
      res.baseMipLevel = 0;
      res.levelCount = 1;
      res.layerCount = 1;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = dVar10;
      subresourceRange.layerCount = 1;
      res.baseArrayLayer = dVar10;
      makeImageView(&local_188,(DeviceInterface *)this,device,colorImage,VK_IMAGE_VIEW_TYPE_2D,
                    caseDef->colorFormat,subresourceRange);
      pdVar11 = (deUint64 *)operator_new(0x20);
      pdVar11[2] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
      pdVar11[3] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_allocator;
      *pdVar11 = local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      pdVar11[1] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_deviceIface;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar11;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d24850;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar11;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                  *)&colorAttachments,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImageView)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
                  );
      }
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                  ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                    *)&attachmentHandles,
                   (iterator)
                   attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (Handle<(vk::HandleType)13> *)
                   colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (attachmentHandles.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
             ((colorAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      dVar10 = dVar10 + 1;
    } while ((int)dVar10 < caseDef->numLayers);
  }
  if (pipeline::(anonymous_namespace)::genTriangleVertices()::data == '\0') {
    _GLOBAL__N_1::renderMultisampledImage();
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (allocator_type *)&bufferCreateInfo);
  bufferSize = (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_248,(DeviceInterface *)this,
                     device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_b8.m_internal._4_4_ = local_248._4_4_;
  local_b8.m_internal._0_4_ = local_248._0_4_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             (DeviceInterface *)this,device,allocator,local_b8,(MemoryRequirement)0x1);
  uVar8 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)this,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),
             *(VkDeviceSize *)(uVar8 + 0x10),bufferSize);
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_248._0_8_ = &local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_248);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,*(ProgramBinary **)(cVar12._M_node + 2),0);
  renderPass = bufferCreateInfo._0_8_;
  DStack_d0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_d0.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  DStack_d0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &local_238) {
    operator_delete((void *)local_248._0_8_,
                    CONCAT44(local_238._M_allocated_capacity._4_4_,
                             local_238._M_allocated_capacity._0_4_) + 1);
  }
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_248._0_8_ = &local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"frag","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_248);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,*(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_70.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_78.m_internal = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &local_238) {
    operator_delete((void *)local_248._0_8_,
                    CONCAT44(local_238._M_allocated_capacity._4_4_,
                             local_238._M_allocated_capacity._0_4_) + 1);
  }
  __n = (ulong)(uint)caseDef->numLayers;
  local_248._0_4_ = 0;
  uVar3 = caseDef->colorFormat;
  uVar6 = caseDef->numSamples;
  VStack_23c = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_238._M_allocated_capacity._0_4_ = 0;
  local_238._M_allocated_capacity._4_4_ = 2;
  local_238._8_4_ = 1;
  local_238._12_4_ = 0;
  VStack_228 = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_248._4_4_ = uVar3;
  local_248._8_4_ = uVar6;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             &pipelines,__n,(value_type *)local_248,(allocator_type *)&bufferCreateInfo);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             &clearValues,__n,(allocator_type *)&bufferCreateInfo);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__n != 0) {
    lVar15 = 0;
    uVar18 = 0;
    do {
      *(int *)((long)clearValues.
                     super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
                     .super__Vector_impl_data._M_start + lVar15) = (int)uVar18;
      *(undefined4 *)
       ((long)clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar15 + 4) = 2;
      bufferCreateInfo.flags = 0;
      bufferCreateInfo._20_4_ = 0;
      bufferCreateInfo.queueFamilyIndexCount = 0;
      bufferCreateInfo._44_4_ = 0;
      bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferCreateInfo._4_4_ = 0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo.size = 1;
      bufferCreateInfo._32_8_ =
           (long)clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar15;
      if (subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
        _M_realloc_insert<vk::VkSubpassDescription_const&>
                  ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
                   &subpasses,
                   (iterator)
                   subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkSubpassDescription *)&bufferCreateInfo);
      }
      else {
        pVVar16 = (VkSubpassDescription *)&bufferCreateInfo;
        pVVar17 = subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          VVar7 = pVVar16->pipelineBindPoint;
          pVVar17->flags = pVVar16->flags;
          pVVar17->pipelineBindPoint = VVar7;
          pVVar16 = (VkSubpassDescription *)((long)pVVar16 + (ulong)bVar19 * -0x10 + 8);
          pVVar17 = (pointer)((long)pVVar17 + (ulong)bVar19 * -0x10 + 8);
        }
        subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             subpasses.
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 8;
    } while (__n != uVar18);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ =
       (ulong)(uint)((int)((ulong)((long)pipelines.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pipelines.
                                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                    0x38e38e39) << 0x20;
  bufferCreateInfo.size =
       (VkDeviceSize)
       pipelines.
       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.usage =
       (int)((ulong)((long)subpasses.
                           super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices._4_4_ << 0x20);
  bufferCreateInfo._40_8_ =
       subpasses.
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ::vk::createRenderPass
            (&local_148,(DeviceInterface *)this,device,(VkRenderPassCreateInfo *)&bufferCreateInfo,
             (VkAllocationCallbacks *)0x0);
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(subpasses.
                    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelines.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelines.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelines.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.m_internal =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_120.m_deviceIface =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_120.m_device =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_120.m_allocator =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo,(DeviceInterface *)this
                  ,device,(VkRenderPass)
                          local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                          m_internal,caseDef->numLayers,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  local_238._M_allocated_capacity._0_4_ = bufferCreateInfo.flags;
  local_238._M_allocated_capacity._4_4_ = bufferCreateInfo._20_4_;
  local_238._8_4_ = (undefined4)bufferCreateInfo.size;
  local_238._12_4_ = (undefined4)(bufferCreateInfo.size >> 0x20);
  local_248._0_4_ = bufferCreateInfo.sType;
  local_248._4_4_ = bufferCreateInfo._4_4_;
  local_248._8_4_ = SUB84(bufferCreateInfo.pNext,0);
  VStack_23c = (VkAttachmentLoadOp)((ulong)bufferCreateInfo.pNext >> 0x20);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,
                     (DeviceInterface *)this,device);
  local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  fragmentModule.m_internal._4_4_ = 0;
  fragmentModule.m_internal._0_4_ = (caseDef->renderSize).m_data[0];
  renderSize.m_data[1] = 0;
  renderSize.m_data[0] = (caseDef->renderSize).m_data[1];
  makeGraphicsPipelines
            (&pipelines,this,(DeviceInterface *)device,(VkDevice)(ulong)(uint)caseDef->numLayers,
             bufferCreateInfo.sType,local_128,(VkRenderPass)renderPass,local_78,fragmentModule,
             renderSize,caseDef->numSamples,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  commandBuffer = local_98;
  beginCommandBuffer((DeviceInterface *)this,local_98);
  iVar2 = caseDef->numLayers;
  format = caseDef->colorFormat;
  bVar9 = ::vk::isUintFormat(format);
  if (bVar9) {
    bufferCreateInfo.pNext = (void *)0x6000000040;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    bufferCreateInfo._4_4_ = 0x20;
  }
  else {
    bVar9 = ::vk::isIntFormat(format);
    uVar14._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    uVar14._4_4_ = 0;
    bufferCreateInfo.pNext = (void *)0x3f8000003f800000;
    if (bVar9) {
      bufferCreateInfo.pNext = (void *)0x6000000040;
    }
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    bufferCreateInfo._4_4_ = 0x20;
    if (!bVar9) {
      bufferCreateInfo._0_8_ = uVar14;
    }
  }
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            (&clearValues,(long)iVar2,(value_type *)&bufferCreateInfo,(allocator_type *)&subpasses);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = local_128.m_internal;
  bufferCreateInfo.size = CONCAT44(local_248._4_4_,local_248._0_4_);
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)
       CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                (int)((ulong)((long)clearValues.
                                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)clearValues.
                                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4));
  bufferCreateInfo._40_8_ = uVar4;
  (**(code **)(*(long *)this + 0x3a0))(this,commandBuffer,&bufferCreateInfo,0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (**(code **)(*(long *)this + 0x2c0))(this,commandBuffer,0,1,&local_b8);
  if (0 < caseDef->numLayers) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      if (lVar15 != 0) {
        (**(code **)(*(long *)this + 0x3a8))(this,commandBuffer,0);
      }
      (**(code **)(*(long *)this + 0x260))
                (this,commandBuffer,0,
                 **(undefined8 **)
                   ((long)&(pipelines.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13));
      (**(code **)(*(long *)this + 0x2c8))
                (this,commandBuffer,
                 (ulong)((long)vertices.
                               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vertices.
                              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar15 < caseDef->numLayers);
  }
  (**(code **)(*(long *)this + 0x3b0))(this,commandBuffer);
  result = (**(code **)(*(long *)this + 0x250))(this,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x34d);
  submitCommandsAndWait((DeviceInterface *)this,device,queue,commandBuffer);
  if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipelines);
  if (local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkPipelineLayout)
               local_148.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  obj.m_internal._4_4_ = local_248._4_4_;
  obj.m_internal._0_4_ = local_248._0_4_;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_248 + 8),obj);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_120,(VkRenderPass)local_128.m_internal);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_d0,(VkShaderModule)renderPass);
  }
  if (uVar8 != 0) {
    (**(code **)(*(long *)uVar8 + 8))(uVar8);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
  }
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  if (commandBuffer != (VkCommandBuffer)0x0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*plStack_90 + 0x240))(plStack_90,_local_88,VStack_80,1);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_50,local_58);
  }
  return;
}

Assistant:

void renderMultisampledImage (Context& context, const CaseDef& caseDef, const VkImage colorImage)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	{
		// Create an image view (attachment) for each layer of the image
		std::vector<ImageViewSp>	colorAttachments;
		std::vector<VkImageView>	attachmentHandles;
		for (int i = 0; i < caseDef.numLayers; ++i)
		{
			colorAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, colorImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.colorFormat, makeColorSubresourceRange(i, 1))));
			attachmentHandles.push_back(**colorAttachments.back());
		}

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genTriangleVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		const Unique<VkShaderModule>	vertexModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeMultisampleRenderPass	(vk, device, caseDef.colorFormat, caseDef.numSamples, caseDef.numLayers));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer			(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
																					 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout			(vk, device));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines		(vk, device, caseDef.numLayers, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																					 caseDef.renderSize, caseDef.numSamples, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST));

		beginCommandBuffer(vk, *cmdBuffer);

		const std::vector<VkClearValue> clearValues(caseDef.numLayers, getClearValue(caseDef.colorFormat));

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*renderPass,									// VkRenderPass            renderPass;
			*framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			static_cast<deUint32>(clearValues.size()),		// uint32_t                clearValueCount;
			&clearValues[0],								// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		for (int layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
		{
			if (layerNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[layerNdx]);

			vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}
}